

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O3

Var __thiscall Func::AllocateNumber(Func *this,double value)

{
  code *pcVar1;
  bool bVar2;
  uint64 uVar3;
  uint64 uVar4;
  undefined4 *puVar5;
  
  uVar3 = Js::NumberUtilities::ToSpecial(value);
  bVar2 = Js::NumberUtilities::IsNan(value);
  if (bVar2) {
    uVar4 = Js::NumberUtilities::ToSpecial(value);
    if (uVar4 != 0xfff8000000000000) {
      uVar4 = Js::NumberUtilities::ToSpecial(value);
      if (uVar4 != 0x7ff8000000000000) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Library/JavascriptNumber.inl"
                           ,0xa2,
                           "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                           ,"We should only produce a NaN with this value");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
    }
  }
  return (Var)(uVar3 ^ 0xfffc000000000000);
}

Assistant:

Js::Var
Func::AllocateNumber(double value)
{
    Js::Var number = nullptr;
#if FLOATVAR
    number = Js::JavascriptNumber::NewCodeGenInstance((double)value, nullptr);
#else
    if (!IsOOPJIT()) // in-proc jit
    {
        number = Js::JavascriptNumber::NewCodeGenInstance(GetNumberAllocator(), (double)value, GetScriptContext());
    }
    else // OOP JIT
    {
        number = GetXProcNumberAllocator()->AllocateNumber(this, value);
    }
#endif

    return number;
}